

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void P_BringUpWeapon(player_t *player)

{
  double dVar1;
  int iVar2;
  AWeapon *pAVar3;
  AWeapon *pAVar4;
  APlayerPawn *ent;
  DPSprite *pDVar5;
  long lVar6;
  AInventory *pAVar7;
  FState *newstate;
  AWeapon *pAVar8;
  FSoundID local_1c;
  
  pAVar3 = player->PendingWeapon;
  if (pAVar3 == (AWeapon *)0x0) {
    pAVar8 = (AWeapon *)0x0;
  }
  else {
    if (pAVar3 == (AWeapon *)0xffffffffffffffff) {
      if (player->ReadyWeapon == (AWeapon *)0x0) {
        return;
      }
      pDVar5 = player_t::GetPSprite(player,PSP_WEAPON);
      pDVar5->y = 32.375;
      pAVar8 = player->ReadyWeapon;
      lVar6 = 0x230;
      goto LAB_0052c74a;
    }
    pAVar4 = (pAVar3->SisterWeapon).field_0.p;
    pAVar8 = pAVar3;
    if (pAVar4 != (AWeapon *)0x0) {
      if ((*(byte *)((long)&(pAVar4->super_AInventory).super_AActor.super_DThinker + 0x20) & 0x20)
          == 0) {
        if ((((((((pAVar3->SisterWeapon).field_0.p)->super_AInventory).field_0x4dd & 4) == 0) ||
             (pAVar7 = AActor::FindInventory
                                 (&player->mo->super_AActor,
                                  (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true),
             pAVar7 == (AInventory *)0x0)) ||
            (pAVar8 = (pAVar3->SisterWeapon).field_0.p, pAVar8 == (AWeapon *)0x0)) ||
           (((pAVar8->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20
            ) == 0)) goto LAB_0052c69f;
        pAVar8 = (AWeapon *)0x0;
      }
      (pAVar3->SisterWeapon).field_0.p = (AWeapon *)0x0;
    }
  }
LAB_0052c69f:
  player->PendingWeapon = (AWeapon *)0xffffffffffffffff;
  player->ReadyWeapon = pAVar8;
  ent = player->mo;
  (ent->super_AActor).weaponspecial = 0;
  if (pAVar8 == (AWeapon *)0x0) {
    return;
  }
  iVar2 = (pAVar8->UpSound).super_FSoundID.ID;
  if (iVar2 != 0) {
    local_1c.ID = iVar2;
    S_Sound(&ent->super_AActor,1,&local_1c,1.0,1.0);
  }
  player->refire = 0;
  dVar1 = *(double *)(&DAT_00740ef0 + (ulong)(((uint)player->cheats >> 0xb & 1) == 0) * 8);
  pDVar5 = player_t::GetPSprite(player,PSP_WEAPON);
  pDVar5->y = dVar1;
  pDVar5 = player_t::GetPSprite(player,PSP_FLASH);
  DPSprite::SetState(pDVar5,(FState *)0x0,false);
  lVar6 = 0x220;
LAB_0052c74a:
  newstate = (FState *)
             (**(code **)((long)(pAVar8->super_AInventory).super_AActor.super_DThinker.super_DObject
                                ._vptr_DObject + lVar6))(pAVar8);
  pDVar5 = player_t::GetPSprite(player,PSP_WEAPON);
  DPSprite::SetState(pDVar5,newstate,false);
  return;
}

Assistant:

void P_BringUpWeapon (player_t *player)
{
	AWeapon *weapon;

	if (player->PendingWeapon == WP_NOCHANGE)
	{
		if (player->ReadyWeapon != nullptr)
		{
			player->GetPSprite(PSP_WEAPON)->y = WEAPONTOP;
			P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetReadyState());
		}
		return;
	}

	weapon = player->PendingWeapon;

	// If the player has a tome of power, use this weapon's powered up
	// version, if one is available.
	if (weapon != nullptr &&
		weapon->SisterWeapon &&
		weapon->SisterWeapon->WeaponFlags & WIF_POWERED_UP &&
		player->mo->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true))
	{
		weapon = weapon->SisterWeapon;
	}

	player->PendingWeapon = WP_NOCHANGE;
	player->ReadyWeapon = weapon;
	player->mo->weaponspecial = 0;

	if (weapon != nullptr)
	{
		if (weapon->UpSound)
		{
			S_Sound (player->mo, CHAN_WEAPON, weapon->UpSound, 1, ATTN_NORM);
		}
		player->refire = 0;

		player->GetPSprite(PSP_WEAPON)->y = player->cheats & CF_INSTANTWEAPSWITCH
			? WEAPONTOP : WEAPONBOTTOM;
		// make sure that the previous weapon's flash state is terminated.
		// When coming here from a weapon drop it may still be active.
		P_SetPsprite(player, PSP_FLASH, nullptr);
		P_SetPsprite(player, PSP_WEAPON, weapon->GetUpState());
	}
}